

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetItemWithAttributes
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          Var value,PropertyAttributes attributes)

{
  JavascriptLibrary *pJVar1;
  Var aValue;
  IndexPropertyDescriptorMap *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *function;
  PropertyAttributes attributes_00;
  undefined3 in_register_00000089;
  undefined4 uVar6;
  undefined1 local_68 [8];
  int i;
  uint32 local_50;
  undefined4 local_4c;
  IndexPropertyDescriptor *local_48;
  IndexPropertyDescriptor *descriptor;
  uint32 local_34;
  
  uVar6 = CONCAT31(in_register_00000089,attributes);
  if ((this->lengthWritable == false) &&
     ((arr->super_JavascriptArray).super_ArrayObject.length <= index)) {
    return 0;
  }
  descriptor = (IndexPropertyDescriptor *)value;
  bVar3 = DynamicObject::GetHasNoEnumerableProperties((DynamicObject *)arr);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    local_34 = index;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                ,0x1e8,"(!arr->GetHasNoEnumerableProperties())",
                                "!arr->GetHasNoEnumerableProperties()");
    if (!bVar3) goto LAB_00dca087;
    *puVar5 = 0;
    index = local_34;
  }
  if (((attributes & 4) == 0) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)this,false),
     ((this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler.flags & 0x20) != 0)) {
    pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
    local_4c = uVar6;
    local_34 = index;
    Memory::Recycler::WBSetBit(local_68);
    index = local_34;
    local_68 = (undefined1  [8])&pJVar1->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
    uVar6 = local_4c;
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)local_68);
  }
  local_50 = index;
  bVar3 = JsUtil::
          BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_50,&local_48,
                     (int *)local_68);
  attributes_00 = (PropertyAttributes)uVar6;
  if (bVar3) {
    if ((local_48->Attributes & 8) == 0) {
      local_48->Attributes = attributes_00;
      BVar4 = JavascriptArray::DirectGetItemAt<void*>
                        (&arr->super_JavascriptArray,index,(void **)local_68);
      if (BVar4 == 0) {
        aValue = (local_48->Setter).ptr;
        if (aValue == (Var)0x0) {
          return 1;
        }
        function = VarTo<Js::RecyclableObject>(aValue);
        JavascriptOperators::CallSetter(function,instance,descriptor,(ScriptContext *)0x0);
        return 1;
      }
    }
    else {
      if (((local_48->Getter).ptr != (void *)0x0) || ((local_48->Setter).ptr != (void *)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                    ,0x1f8,"(!descriptor->Getter && !descriptor->Setter)",
                                    "!descriptor->Getter && !descriptor->Setter");
        if (!bVar3) goto LAB_00dca087;
        *puVar5 = 0;
      }
      local_48->Attributes = attributes_00;
    }
    JavascriptArray::DirectSetItemAt<void*>(&arr->super_JavascriptArray,index,descriptor);
  }
  else {
    bVar3 = DynamicObject::GetHasNoEnumerableProperties((DynamicObject *)arr);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0x20e,"(!arr->GetHasNoEnumerableProperties())",
                                  "!arr->GetHasNoEnumerableProperties()");
      if (!bVar3) {
LAB_00dca087:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    JavascriptArray::DirectSetItemAt<void*>(&arr->super_JavascriptArray,index,descriptor);
    this_00 = (this->indexPropertyMap).ptr;
    IndexPropertyDescriptor::IndexPropertyDescriptor
              ((IndexPropertyDescriptor *)local_68,attributes_00,(Var)0x0,(Var)0x0);
    IndexPropertyDescriptorMap::Add(this_00,index,(IndexPropertyDescriptor *)local_68);
  }
  return 1;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes(ES5Array* arr, DynamicObject* instance, uint32 index, Var value, PropertyAttributes attributes)
    {
        // Reject if we need to grow non-writable length
        if (!CanSetItemAt(arr, index))
        {
            return false;
        }

        // We don't track non-enumerable items in object array.  Objects with an object array
        // report having enumerable properties.  See DynamicObject::GetHasNoEnumerableProperties.
        // Array objects (which don't have an object array, and could report their hasNoEnumerableProperties
        // directly) take an explicit type transition before switching to ES5ArrayTypeHandler, so their
        // hasNoEnumerableProperties flag gets cleared.
        Assert(!arr->GetHasNoEnumerableProperties());

        if (!(attributes & PropertyWritable))
        {
            this->ClearHasOnlyWritableDataProperties();
            if(this->GetFlags() & this->IsPrototypeFlag)
            {
                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
            }
        }

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                Assert(!descriptor->Getter && !descriptor->Setter);
                descriptor->Attributes = attributes;
                arr->DirectSetItemAt(index, value);
                return true;
            }

            descriptor->Attributes = attributes;

            if (HasDataItem(arr, index))
            {
                arr->DirectSetItemAt(index, value);
            }
            else if (descriptor->Setter)
            {
                RecyclableObject* func = VarTo<RecyclableObject>(descriptor->Setter);
                // TODO : request context
                JavascriptOperators::CallSetter(func, instance, value, NULL);
            }
        }
        else
        {
            // See comment for the same assert above.
            Assert(!arr->GetHasNoEnumerableProperties());

            // Not found in attribute map
            arr->DirectSetItemAt(index, value);
            indexPropertyMap->Add(index, IndexPropertyDescriptor(attributes));
        }

        return true;
    }